

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_expr.cc
# Opt level: O0

void setup_getitem<kratos::PackedSlice,kratos::Var>
               (class_<kratos::PackedSlice,_std::shared_ptr<kratos::PackedSlice>,_kratos::Var>
                *class_,bool add_str)

{
  class_<kratos::PackedSlice,std::shared_ptr<kratos::PackedSlice>,kratos::Var> *pcVar1;
  return_value_policy local_19;
  type local_18;
  return_value_policy local_17;
  type local_16;
  return_value_policy local_15;
  type local_14;
  return_value_policy local_13;
  type local_12;
  byte local_11;
  class_<kratos::PackedSlice,std::shared_ptr<kratos::PackedSlice>,kratos::Var> *pcStack_10;
  bool add_str_local;
  class_<kratos::PackedSlice,_std::shared_ptr<kratos::PackedSlice>,_kratos::Var> *class__local;
  
  local_13 = reference;
  local_11 = add_str;
  pcStack_10 = (class_<kratos::PackedSlice,std::shared_ptr<kratos::PackedSlice>,kratos::Var> *)
               class_;
  pcVar1 = (class_<kratos::PackedSlice,std::shared_ptr<kratos::PackedSlice>,kratos::Var> *)
           pybind11::class_<kratos::PackedSlice,std::shared_ptr<kratos::PackedSlice>,kratos::Var>::
           def<setup_getitem<kratos::PackedSlice,kratos::Var>(pybind11::class_<kratos::PackedSlice,std::shared_ptr<kratos::PackedSlice>,kratos::Var>&,bool)::_lambda(kratos::PackedSlice&,unsigned_int)_1_,pybind11::return_value_policy>
                     ((class_<kratos::PackedSlice,std::shared_ptr<kratos::PackedSlice>,kratos::Var>
                       *)class_,"__getitem__",&local_12,&local_13);
  local_15 = reference;
  pcVar1 = (class_<kratos::PackedSlice,std::shared_ptr<kratos::PackedSlice>,kratos::Var> *)
           pybind11::class_<kratos::PackedSlice,std::shared_ptr<kratos::PackedSlice>,kratos::Var>::
           def<setup_getitem<kratos::PackedSlice,kratos::Var>(pybind11::class_<kratos::PackedSlice,std::shared_ptr<kratos::PackedSlice>,kratos::Var>&,bool)::_lambda(kratos::PackedSlice&,std::pair<unsigned_int,unsigned_int>)_1_,pybind11::return_value_policy>
                     (pcVar1,"__getitem__",&local_14,&local_15);
  local_17 = reference;
  pybind11::class_<kratos::PackedSlice,std::shared_ptr<kratos::PackedSlice>,kratos::Var>::
  def<setup_getitem<kratos::PackedSlice,kratos::Var>(pybind11::class_<kratos::PackedSlice,std::shared_ptr<kratos::PackedSlice>,kratos::Var>&,bool)::_lambda(kratos::PackedSlice&,std::shared_ptr<kratos::Var>const&)_1_,pybind11::return_value_policy>
            (pcVar1,"__getitem__",&local_16,&local_17);
  if ((local_11 & 1) != 0) {
    local_19 = reference;
    pybind11::class_<kratos::PackedSlice,std::shared_ptr<kratos::PackedSlice>,kratos::Var>::
    def<setup_getitem<kratos::PackedSlice,kratos::Var>(pybind11::class_<kratos::PackedSlice,std::shared_ptr<kratos::PackedSlice>,kratos::Var>&,bool)::_lambda(kratos::PackedSlice&,std::__cxx11::string_const&)_1_,pybind11::return_value_policy>
              (pcStack_10,"__getitem__",&local_18,&local_19);
  }
  return;
}

Assistant:

void setup_getitem(py::class_<T, ::shared_ptr<T>, K> &class_, bool add_str = true) {
    using namespace kratos;
    class_
        .def(
            "__getitem__",
            [](T & var, uint32_t index) -> auto & { return var.Var::operator[](index); },
            py::return_value_policy::reference)
        .def(
            "__getitem__", [](T & var, std::pair<uint32_t, uint32_t> slice) -> auto & {
                return var.Var::operator[](slice);
            },
            py::return_value_policy::reference)
        .def(
            "__getitem__", [](T & var, const std::shared_ptr<kratos::Var> &slice) -> auto & {
                return var.Var::operator[](slice);
            },
            py::return_value_policy::reference);

    if (add_str) {
        class_.def(
            "__getitem__", [](T & var, const std::string &name) -> auto & { return var[name]; },
            py::return_value_policy::reference);
    }
}